

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Abc_NtkFxInsert(Abc_Ntk_t *pNtk,Vec_Wec_t *vCubes)

{
  Mem_Flex_t *pMan;
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Vec_Int_t *p;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Abc_Obj_t *pAVar9;
  char *pSop;
  int iVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0xba,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
  }
  iVar2 = -1;
  iVar10 = 0;
  while( true ) {
    iVar1 = vCubes->nSize;
    if (iVar1 <= iVar10) {
      iVar2 = 0;
      for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
        pVVar5 = Vec_WecEntry(vCubes,iVar10);
        iVar1 = Vec_IntEntry(pVVar5,0);
        if (iVar2 <= iVar1) {
          iVar2 = iVar1;
        }
        iVar1 = vCubes->nSize;
      }
      iVar10 = pNtk->vObjs->nSize;
      if (iVar10 <= iVar2) {
        while (iVar10 <= iVar2) {
          pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
          bVar13 = iVar10 != pAVar6->Id;
          iVar10 = iVar10 + 1;
          if (bVar13) {
            __assert_fail("i == (int)Abc_ObjId(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                          ,0xd0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
          }
        }
        pVVar5 = Vec_IntStart(pNtk->vObjs->nSize);
        p = Vec_IntStart(pNtk->vObjs->nSize);
        for (iVar2 = 0; iVar2 < vCubes->nSize; iVar2 = iVar2 + 1) {
          pVVar7 = Vec_WecEntry(vCubes,iVar2);
          iVar10 = Vec_IntEntry(pVVar7,0);
          iVar1 = Vec_IntEntry(p,iVar10);
          if (iVar1 == 0) {
            Vec_IntWriteEntry(pVVar5,iVar10,iVar2);
          }
          Vec_IntAddToEntry(p,iVar10,1);
        }
        pVVar7 = Vec_IntStartFull(pNtk->vObjs->nSize);
        iVar2 = 0;
        do {
          if (pNtk->vObjs->nSize <= iVar2) {
            Vec_IntFree(pVVar5);
            Vec_IntFree(p);
            Vec_IntFree(pVVar7);
            return;
          }
          pAVar6 = Abc_NtkObj(pNtk,iVar2);
          if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
            Abc_ObjRemoveFanins(pAVar6);
            iVar10 = Vec_IntEntry(p,iVar2);
            if (iVar10 < 1) {
              __assert_fail("Vec_IntEntry(vCount, i) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                            ,0xe3,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
            }
            for (iVar10 = 0; iVar1 = Vec_IntEntry(p,iVar2), iVar10 < iVar1; iVar10 = iVar10 + 1) {
              iVar1 = Vec_IntEntry(pVVar5,iVar2);
              pVVar8 = Vec_WecEntry(vCubes,iVar1 + iVar10);
              iVar1 = Vec_IntEntry(pVVar8,0);
              if (iVar1 != iVar2) {
                __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                              ,0xe7,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
              }
              for (iVar1 = 1; iVar1 < pVVar8->nSize; iVar1 = iVar1 + 1) {
                iVar3 = Vec_IntEntry(pVVar8,iVar1);
                iVar3 = Abc_Lit2Var(iVar3);
                pAVar9 = Abc_NtkObj(pNtk,iVar3);
                iVar3 = Vec_IntEntry(pVVar7,pAVar9->Id);
                if (iVar3 < 0) {
                  Vec_IntWriteEntry(pVVar7,pAVar9->Id,(pAVar6->vFanins).nSize);
                  Abc_ObjAddFanin(pAVar6,pAVar9);
                }
              }
            }
            pMan = (Mem_Flex_t *)pNtk->pManFunc;
            iVar10 = Vec_IntEntry(p,iVar2);
            pSop = Abc_SopStart(pMan,iVar10,(pAVar6->vFanins).nSize);
            pcVar12 = pSop;
            for (iVar10 = 0; iVar1 = Vec_IntEntry(p,iVar2), iVar10 < iVar1; iVar10 = iVar10 + 1) {
              iVar1 = Vec_IntEntry(pVVar5,iVar2);
              pVVar8 = Vec_WecEntry(vCubes,iVar1 + iVar10);
              iVar1 = Vec_IntEntry(pVVar8,0);
              if (iVar1 != iVar2) {
                __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                              ,0xf6,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
              }
              for (iVar1 = 1; iVar1 < pVVar8->nSize; iVar1 = iVar1 + 1) {
                iVar3 = Vec_IntEntry(pVVar8,iVar1);
                i = Abc_Lit2Var(iVar3);
                pAVar9 = Abc_NtkObj(pNtk,i);
                uVar4 = Vec_IntEntry(pVVar7,pAVar9->Id);
                if (((int)uVar4 < 0) || ((pAVar6->vFanins).nSize <= (int)uVar4)) {
                  __assert_fail("iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                                ,0xfb,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
                }
                iVar3 = Abc_LitIsCompl(iVar3);
                pcVar12[uVar4] = iVar3 == 0 | 0x30;
              }
              pcVar12 = pcVar12 + (long)(pAVar6->vFanins).nSize + 3;
            }
            if (((char *)(pAVar6->field_5).pData != (char *)0x0) &&
               (iVar10 = Abc_SopIsComplement((char *)(pAVar6->field_5).pData), iVar10 != 0)) {
              Abc_SopComplement(pSop);
            }
            (pAVar6->field_5).pData = pSop;
            for (lVar11 = 0; lVar11 < (pAVar6->vFanins).nSize; lVar11 = lVar11 + 1) {
              Vec_IntWriteEntry(pVVar7,*(int *)((long)pAVar6->pNtk->vObjs->pArray
                                                      [(pAVar6->vFanins).pArray[lVar11]] + 0x10),-1)
              ;
            }
          }
          iVar2 = iVar2 + 1;
        } while( true );
      }
      puts("The network is unchanged by fast extract.");
      return;
    }
    pVVar5 = Vec_WecEntry(vCubes,iVar10);
    if (pVVar5->nSize < 1) {
      __assert_fail("Vec_IntSize(vCube) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0xbf,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
    }
    iVar1 = Vec_IntEntry(pVVar5,0);
    if (iVar1 < iVar2) break;
    iVar2 = Vec_IntEntry(pVVar5,0);
    iVar10 = iVar10 + 1;
  }
  __assert_fail("Lit <= Vec_IntEntry(vCube, 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                ,0xc0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
}

Assistant:

void Abc_NtkFxInsert( Abc_Ntk_t * pNtk, Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube, * vPres, * vFirst, * vCount;
    Abc_Obj_t * pNode, * pFanin;
    char * pCube, * pSop;
    int i, k, v, Lit, iFanin, iNodeMax = 0;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check that cubes have no gaps and are ordered by first node
    Lit = -1;
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        assert( Lit <= Vec_IntEntry(vCube, 0) );
        Lit = Vec_IntEntry(vCube, 0);
    }
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        iNodeMax = Abc_MaxInt( iNodeMax, Vec_IntEntry(vCube, 0) );
    // quit if nothing changes
    if ( iNodeMax < Abc_NtkObjNumMax(pNtk) )
    {
        printf( "The network is unchanged by fast extract.\n" );
        return;
    }
    // create new nodes
    for ( i = Abc_NtkObjNumMax(pNtk); i <= iNodeMax; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtk );
        assert( i == (int)Abc_ObjId(pNode) );
    }
    // create node fanins
    vFirst = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vCount = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // create node SOPs
    vPres = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Vec_IntEntry(vCount, i) == 0 ) continue;
        Abc_ObjRemoveFanins( pNode );
        // create fanins
        assert( Vec_IntEntry(vCount, i) > 0 );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                if ( Vec_IntEntry(vPres, Abc_ObjId(pFanin)) >= 0 )
                    continue;
                Vec_IntWriteEntry(vPres, Abc_ObjId(pFanin), Abc_ObjFaninNum(pNode));
                Abc_ObjAddFanin( pNode, pFanin );
            }
        }
        // create SOP
        pSop = pCube = Abc_SopStart( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntEntry(vCount, i), Abc_ObjFaninNum(pNode) );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                iFanin = Vec_IntEntry(vPres, Abc_ObjId(pFanin));
                assert( iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode) );
                pCube[iFanin] = Abc_LitIsCompl(Lit) ? '0' : '1';
            }
            pCube += Abc_ObjFaninNum(pNode) + 3;
        }
        // complement SOP if the original one was complemented
        if ( pNode->pData && Abc_SopIsComplement((char *)pNode->pData) )
            Abc_SopComplement( pSop );
        pNode->pData = pSop;
        // clean fanins
        Abc_ObjForEachFanin( pNode, pFanin, v )
            Vec_IntWriteEntry( vPres, Abc_ObjId(pFanin), -1 );
    }
    Vec_IntFree( vFirst );
    Vec_IntFree( vCount );
    Vec_IntFree( vPres );
}